

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcProductDefinitionShape::IfcProductDefinitionShape
          (IfcProductDefinitionShape *this)

{
  *(undefined ***)&(this->super_IfcProductRepresentation).field_0x88 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x90 = 0;
  *(char **)&this->field_0x98 = "IfcProductDefinitionShape";
  IfcProductRepresentation::IfcProductRepresentation
            (&this->super_IfcProductRepresentation,&PTR_construction_vtable_24__008cb820);
  (this->super_IfcProductRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x8cb7b8;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x88 = 0x8cb808;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x78 = 0x8cb7e0;
  return;
}

Assistant:

IfcProductDefinitionShape() : Object("IfcProductDefinitionShape") {}